

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O1

void __thiscall
poly::
vector<Interface,custom::Allocator<Interface,custom::AllocatorDescriptor<std::integral_constant<bool,false>,std::integral_constant<bool,false>,std::integral_constant<bool,false>,std::integral_constant<bool,true>,std::integral_constant<bool,true>>>,poly::delegate_cloning_policy<Interface,custom::Allocator<Interface,custom::AllocatorDescriptor<std::integral_constant<bool,false>,std::integral_constant<bool,false>,std::integral_constant<bool,false>,std::integral_constant<bool,true>,std::integral_constant<bool,true>>>,std::integral_constant<bool,true>>>
::push_back_new_elem_w_storage_increase<Impl1,Impl1>
          (vector<Interface,custom::Allocator<Interface,custom::AllocatorDescriptor<std::integral_constant<bool,false>,std::integral_constant<bool,false>,std::integral_constant<bool,false>,std::integral_constant<bool,true>,std::integral_constant<bool,true>>>,poly::delegate_cloning_policy<Interface,custom::Allocator<Interface,custom::AllocatorDescriptor<std::integral_constant<bool,false>,std::integral_constant<bool,false>,std::integral_constant<bool,false>,std::integral_constant<bool,true>,std::integral_constant<bool,true>>>,std::integral_constant<bool,true>>>
           *this,Impl1 *param_2)

{
  long lVar1;
  undefined8 *puVar2;
  void_pointer pvVar3;
  vector<Interface,custom::Allocator<Interface,custom::AllocatorDescriptor<std::integral_constant<bool,false>,std::integral_constant<bool,false>,std::integral_constant<bool,false>,std::integral_constant<bool,true>,std::integral_constant<bool,true>>>,poly::delegate_cloning_policy<Interface,custom::Allocator<Interface,custom::AllocatorDescriptor<std::integral_constant<bool,false>,std::integral_constant<bool,false>,std::integral_constant<bool,false>,std::integral_constant<bool,true>,std::integral_constant<bool,true>>>,std::integral_constant<bool,true>>>
  *pvVar4;
  long lVar5;
  undefined8 uVar6;
  long v_1;
  ulong uVar7;
  undefined8 *puVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  undefined8 *puVar12;
  long v_3;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  Impl1 *this_00;
  undefined8 *puVar16;
  vector<Interface,_custom::Allocator<Interface,_custom::AllocatorDescriptor<std::integral_constant<bool,_false>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>_>,_poly::delegate_cloning_policy<Interface,_custom::Allocator<Interface,_custom::AllocatorDescriptor<std::integral_constant<bool,_false>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>_>,_std::integral_constant<bool,_true>_>_>
  v;
  undefined1 local_79;
  allocator_base<custom::Allocator<unsigned_char,_custom::AllocatorDescriptor<std::integral_constant<bool,_false>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>_>_>
  local_78;
  undefined8 *local_68;
  undefined8 *puStack_60;
  ulong local_58;
  undefined8 *local_48;
  Impl1 *local_40;
  vector<Interface,custom::Allocator<Interface,custom::AllocatorDescriptor<std::integral_constant<bool,false>,std::integral_constant<bool,false>,std::integral_constant<bool,false>,std::integral_constant<bool,true>,std::integral_constant<bool,true>>>,poly::delegate_cloning_policy<Interface,custom::Allocator<Interface,custom::AllocatorDescriptor<std::integral_constant<bool,false>,std::integral_constant<bool,false>,std::integral_constant<bool,false>,std::integral_constant<bool,true>,std::integral_constant<bool,true>>>,std::integral_constant<bool,true>>>
  *local_38;
  
  lVar5 = *(long *)this;
  lVar11 = *(long *)(this + 0x10);
  uVar15 = 1;
  if (0x27 < (ulong)(*(long *)(this + 0x18) - lVar5)) {
    uVar15 = (ulong)(*(long *)(this + 0x18) - lVar5) / 0x14 & 0xfffffffffffffffe;
  }
  uVar9 = 8;
  if (8 < *(ulong *)(this + 0x20)) {
    uVar9 = *(ulong *)(this + 0x20);
  }
  lVar1 = uVar9 - 1;
  uVar13 = uVar9;
  for (lVar14 = lVar5; lVar14 != lVar11; lVar14 = lVar14 + 0x28) {
    uVar10 = *(long *)(lVar14 + 0x18) + lVar1;
    uVar13 = (uVar13 - uVar10 % uVar9) + uVar10;
  }
  uVar7 = (uVar9 - (uVar9 + 0x2f) % uVar9) + 0x2f;
  uVar10 = uVar7;
  if (lVar5 != lVar11) {
    lVar14 = (lVar11 - lVar5 >> 3) * -0x3333333333333333;
    uVar10 = (lVar14 + uVar13 + uVar7) / (lVar14 + 1U);
  }
  lVar11 = lVar11 - lVar5 >> 3;
  lVar5 = 0;
  if ((ulong)(lVar11 * -0x3333333333333333) <= uVar15) {
    lVar5 = uVar15 + lVar11 * 0x3333333333333333;
  }
  local_68 = (undefined8 *)0x0;
  puStack_60 = (undefined8 *)0x0;
  local_78._storage = (undefined8 *)0x0;
  local_78._end_storage = (void_pointer)0x0;
  local_58 = 8;
  local_40 = param_2;
  vector_impl::
  allocator_base<custom::Allocator<unsigned_char,_custom::AllocatorDescriptor<std::integral_constant<bool,_false>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>_>_>
  ::allocate(&local_78,uVar7 + uVar15 * 0x28 + uVar13 + lVar5 * uVar10);
  puVar16 = (undefined8 *)local_78._storage;
  local_68 = (undefined8 *)local_78._storage;
  puStack_60 = (undefined8 *)((long)local_78._storage + uVar15 * 5 * 8);
  puVar12 = *(undefined8 **)this;
  puVar2 = *(undefined8 **)(this + 0x10);
  local_58 = uVar9;
  local_48 = puStack_60;
  local_38 = this;
  if (uVar15 != 0) {
    memset(local_78._storage,0,((uVar15 * 0x28 - 0x28) / 0x28) * 0x28 + 0x28);
  }
  if (puVar12 != puVar2) {
    puVar8 = local_48;
    do {
      *puVar16 = *puVar12;
      puVar16[1] = puVar12[1];
      puVar16[2] = puVar12[2];
      puVar16[3] = puVar12[3];
      puVar16[4] = puVar12[4];
      lVar5 = (lVar1 - (ulong)(lVar1 + (long)puVar8) % uVar9) + (long)puVar8;
      puVar16[1] = lVar5;
      uVar6 = (*(code *)*puVar12)(&local_79,puVar12[2],lVar5,1);
      puVar16[2] = uVar6;
      puVar8 = (undefined8 *)(puVar16[1] + puVar16[3]);
      puVar12 = puVar12 + 5;
      puVar16 = puVar16 + 5;
    } while (puVar12 != puVar2);
  }
  pvVar4 = local_38;
  puStack_60 = local_48;
  local_68 = puVar16;
  if ((puVar16 != local_48) && (7 < local_58)) {
    puVar12 = local_48;
    if (puVar16 != (undefined8 *)local_78._storage) {
      puVar12 = (undefined8 *)(puVar16[-4] + puVar16[-2]);
    }
    if ((void_pointer)
        ((long)puVar12 + (local_58 - ((long)puVar12 + (local_58 - 1)) % local_58) + 0x2f) <=
        local_78._end_storage) {
      puVar12 = local_48;
      if (puVar16 != (undefined8 *)local_78._storage) {
        puVar12 = (undefined8 *)(puVar16[-4] + puVar16[-2]);
      }
      this_00 = (Impl1 *)(((local_58 - 1) - ((local_58 - 1) + (long)puVar12) % local_58) +
                         (long)puVar12);
      Impl1::Impl1(this_00,local_40);
      *local_68 = delegate_cloning_policy<Interface,_custom::Allocator<Interface,_custom::AllocatorDescriptor<std::integral_constant<bool,_false>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>_>,_std::integral_constant<bool,_true>_>
                  ::clone_func<Impl1>;
      local_68[1] = this_00;
      local_68[2] = this_00;
      local_68[3] = 0x30;
      local_68[4] = 8;
      puVar12 = *(undefined8 **)pvVar4;
      *(void_pointer *)pvVar4 = local_78._storage;
      pvVar3 = *(void_pointer *)(pvVar4 + 8);
      *(void_pointer *)(pvVar4 + 8) = local_78._end_storage;
      puVar2 = *(undefined8 **)(pvVar4 + 0x10);
      *(undefined8 **)(pvVar4 + 0x10) = local_68 + 5;
      lVar5 = *(long *)(pvVar4 + 0x18);
      *(undefined8 **)(pvVar4 + 0x18) = puStack_60;
      uVar6 = *(undefined8 *)(pvVar4 + 0x20);
      *(ulong *)(pvVar4 + 0x20) = local_58;
      local_78._storage = puVar12;
      local_78._end_storage = pvVar3;
      local_68 = puVar2;
      puStack_60 = (undefined8 *)lVar5;
      local_58 = uVar6;
      for (; puVar2 != puVar12; puVar12 = puVar12 + 5) {
        (**(code **)(*(long *)puVar12[2] + 0x18))();
        puVar12[2] = 0;
        puVar12[3] = 0;
        *puVar12 = 0;
        puVar12[1] = 0;
        puVar12[4] = 0;
      }
      local_58 = 8;
      puVar12 = (undefined8 *)local_78._storage;
      if (((ulong)((long)puStack_60 - (long)local_78._storage) / 5 & 0xfffffffffffffff8) * 5 != 0) {
        do {
          puVar12[3] = 0;
          puVar12[4] = 0;
          puVar12[1] = 0;
          puVar12[2] = 0;
          puVar12 = puVar12 + 5;
        } while (puVar12 !=
                 (undefined8 *)
                 ((long)local_78._storage +
                 ((ulong)((long)puStack_60 - (long)local_78._storage) / 0x28) * 5 * 8));
      }
      local_68 = (undefined8 *)0x0;
      puStack_60 = (undefined8 *)0x0;
      operator_delete(local_78._storage,(long)local_78._end_storage - (long)local_78._storage);
      local_78._storage = (void_pointer)0x0;
      local_78._end_storage = (void_pointer)0x0;
      operator_delete((void *)0x0,0);
      return;
    }
  }
  __assert_fail("can_construct_new_elem(s, a)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/fecjanky[P]poly_vector/include/poly/vector.h"
                ,0x5a9,
                "void poly::vector<Interface, custom::Allocator<Interface, custom::AllocatorDescriptor<std::integral_constant<bool, false>, std::integral_constant<bool, false>, std::integral_constant<bool, false>, std::integral_constant<bool, true>, std::integral_constant<bool, true>>>>::push_back_new_elem(type_tag<T>, Args &&...) [IF = Interface, Allocator = custom::Allocator<Interface, custom::AllocatorDescriptor<std::integral_constant<bool, false>, std::integral_constant<bool, false>, std::integral_constant<bool, false>, std::integral_constant<bool, true>, std::integral_constant<bool, true>>>, CloningPolicy = poly::delegate_cloning_policy<Interface, custom::Allocator<Interface, custom::AllocatorDescriptor<std::integral_constant<bool, false>, std::integral_constant<bool, false>, std::integral_constant<bool, false>, std::integral_constant<bool, true>, std::integral_constant<bool, true>>>>, T = Impl1, Args = <Impl1>]"
               );
}

Assistant:

inline void vector<I, A, C>::push_back_new_elem_w_storage_increase(
    type_tag<T> /* t */, Args&&... args)
{
    constexpr auto s                = sizeof(T);
    constexpr auto a                = alignof(T);
    constexpr auto noexcept_movable = interface_type_noexcept_movable::value;
    constexpr auto nothrow_ctor     = std::is_nothrow_constructible<T, Args...>::value;
    //////////////////////////////////////////
    const auto new_capacity = std::max(capacity() * 2, size_t(1));
    const auto sizes        = calculate_storage_size(new_capacity, s, a);
    vector v(allocator_traits::select_on_container_copy_construction(base().get_allocator_ref()));
    v.init_layout(sizes.first, new_capacity, sizes.second);
    push_back_new_elem_w_storage_increase_copy(
        v, std::integral_constant < bool, noexcept_movable&& nothrow_ctor > {});
    v.push_back_new_elem(type_tag<T> {}, std::forward<Args>(args)...);
    this->swap(v);
}